

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::EmptyConstraintPS::execute
          (EmptyConstraintPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_1,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *y,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_4,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int32_t iVar9;
  
  iVar3 = this->m_i;
  iVar4 = this->m_old_i;
  if (iVar3 != iVar4) {
    pnVar5 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&pnVar5[iVar4].m_backend.data + 0x20) =
         *(undefined8 *)((long)&pnVar5[iVar3].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[iVar3].m_backend.data;
    uVar7 = *(undefined8 *)((long)&pnVar5[iVar3].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[iVar3].m_backend.data + 0x10);
    uVar8 = *(undefined8 *)(puVar1 + 2);
    puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x10);
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar6;
    *(undefined8 *)((long)&pnVar5[iVar4].m_backend.data + 8) = uVar7;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar3].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar3].m_backend.neg;
    iVar9 = pnVar5[iVar3].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar3].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar9;
    iVar3 = this->m_i;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar4 = this->m_old_i;
    *(undefined8 *)((long)&pnVar5[iVar4].m_backend.data + 0x20) =
         *(undefined8 *)((long)&pnVar5[iVar3].m_backend.data + 0x20);
    uVar6 = *(undefined8 *)&pnVar5[iVar3].m_backend.data;
    uVar7 = *(undefined8 *)((long)&pnVar5[iVar3].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar5[iVar3].m_backend.data + 0x10);
    uVar8 = *(undefined8 *)(puVar1 + 2);
    puVar2 = (uint *)((long)&pnVar5[iVar4].m_backend.data + 0x10);
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar8;
    *(undefined8 *)&pnVar5[iVar4].m_backend.data = uVar6;
    *(undefined8 *)((long)&pnVar5[iVar4].m_backend.data + 8) = uVar7;
    pnVar5[iVar4].m_backend.exp = pnVar5[iVar3].m_backend.exp;
    pnVar5[iVar4].m_backend.neg = pnVar5[iVar3].m_backend.neg;
    iVar9 = pnVar5[iVar3].m_backend.prec_elem;
    pnVar5[iVar4].m_backend.fpclass = pnVar5[iVar3].m_backend.fpclass;
    pnVar5[iVar4].m_backend.prec_elem = iVar9;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_i),0.0);
  iVar3 = this->m_i;
  pnVar5 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)((long)&pnVar5[iVar3].m_backend.data + 0x20) =
       *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 8);
  uVar6 = *(undefined8 *)(this->m_row_obj).m_backend.data._M_elems;
  uVar7 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 2);
  uVar8 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 6);
  puVar1 = (uint *)((long)&pnVar5[iVar3].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 4);
  *(undefined8 *)(puVar1 + 2) = uVar8;
  *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar6;
  *(undefined8 *)((long)&pnVar5[iVar3].m_backend.data + 8) = uVar7;
  pnVar5[iVar3].m_backend.exp = (this->m_row_obj).m_backend.exp;
  pnVar5[iVar3].m_backend.neg = (this->m_row_obj).m_backend.neg;
  iVar9 = (this->m_row_obj).m_backend.prec_elem;
  pnVar5[iVar3].m_backend.fpclass = (this->m_row_obj).m_backend.fpclass;
  pnVar5[iVar3].m_backend.prec_elem = iVar9;
  rStatus->data[this->m_i] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::EmptyConstraintPS::execute(VectorBase<R>&, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // primal:
   s[m_i] = 0.0;

   // dual:
   y[m_i] = m_row_obj;

   // basis:
   rStatus[m_i] = SPxSolverBase<R>::BASIC;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM16 Dimension doesn't match after this step.");
   }

#endif
}